

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O2

int kputsn_(void *p,int l,kstring_t *s)

{
  ulong uVar1;
  char *pcVar2;
  size_t __size;
  size_t sVar3;
  size_t __n;
  
  sVar3 = s->l;
  __n = (size_t)l;
  if (s->m < sVar3 + __n) {
    uVar1 = (sVar3 + __n) - 1;
    uVar1 = uVar1 >> 1 | uVar1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    __size = (uVar1 >> 0x10 | uVar1) + 1;
    s->m = __size;
    pcVar2 = (char *)realloc(s->s,__size);
    if (pcVar2 == (char *)0x0) goto LAB_00132158;
    s->s = pcVar2;
    sVar3 = s->l;
  }
  else {
    pcVar2 = s->s;
  }
  pcVar2 = (char *)memcpy(pcVar2 + sVar3,p,__n);
  s->l = s->l + __n;
LAB_00132158:
  return (int)pcVar2;
}

Assistant:

static inline int kputsn_(const void *p, int l, kstring_t *s)
{
	if (s->l + l > s->m) {
		char *tmp;
		s->m = s->l + l;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	memcpy(s->s + s->l, p, l);
	s->l += l;
	return l;
}